

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# model.cc
# Opt level: O2

void __thiscall
ipx::Model::ScaleBackInteriorSolution
          (Model *this,Vector *x,Vector *xl,Vector *xu,Vector *slack,Vector *y,Vector *zl,Vector *zu
          )

{
  Vector *__v;
  int iVar1;
  int *piVar2;
  double *pdVar3;
  double *pdVar4;
  double *pdVar5;
  double *pdVar6;
  double *pdVar7;
  int *piVar8;
  
  if ((this->colscale_)._M_size != 0) {
    __v = &this->colscale_;
    std::valarray<double>::operator*=(x,__v);
    std::valarray<double>::operator*=(xl,__v);
    std::valarray<double>::operator*=(xu,__v);
    std::valarray<double>::operator/=(zl,__v);
    std::valarray<double>::operator/=(zu,__v);
  }
  if ((this->rowscale_)._M_size != 0) {
    std::valarray<double>::operator*=(y,&this->rowscale_);
    std::valarray<double>::operator/=(slack,&this->rowscale_);
  }
  piVar2 = (this->flipped_vars_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_finish;
  pdVar3 = x->_M_data;
  pdVar4 = xl->_M_data;
  pdVar5 = xu->_M_data;
  pdVar6 = zl->_M_data;
  pdVar7 = zu->_M_data;
  for (piVar8 = (this->flipped_vars_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_start; piVar8 != piVar2; piVar8 = piVar8 + 1) {
    iVar1 = *piVar8;
    pdVar3[iVar1] = -pdVar3[iVar1];
    pdVar5[iVar1] = pdVar4[iVar1];
    pdVar4[iVar1] = INFINITY;
    pdVar7[iVar1] = pdVar6[iVar1];
    pdVar6[iVar1] = 0.0;
  }
  return;
}

Assistant:

void Model::ScaleBackInteriorSolution(Vector& x, Vector& xl, Vector& xu,
                                      Vector& slack, Vector& y, Vector& zl,
                                      Vector& zu) const {
    if (colscale_.size() > 0) {
        x *= colscale_;
        xl *= colscale_;
        xu *= colscale_;
        zl /= colscale_;
        zu /= colscale_;
    }
    if (rowscale_.size() > 0) {
        y *= rowscale_;
        slack /= rowscale_;
    }
    for (Int j : flipped_vars_) {
        assert(std::isfinite(xl[j]));
        assert(std::isinf(xu[j]));
        assert(zu[j] == 0.0);
        x[j] *= -1.0;
        xu[j] = xl[j];
        xl[j] = INFINITY;
        zu[j] = zl[j];
        zl[j] = 0.0;
    }
}